

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

int __thiscall
slang::SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection>::copy
          (SmallVectorBase<slang::ast::CheckerInstanceSymbol::Connection> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  size_type sVar1;
  byte *pbVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  pointer pCVar6;
  pointer pCVar7;
  pointer pCVar8;
  byte *pbVar9;
  byte bVar10;
  
  bVar10 = 0;
  sVar1 = this->len;
  if (sVar1 == 0) {
    return 0;
  }
  pbVar2 = (byte *)(*(long *)(*(long *)dst + 8) + 7U & 0xfffffffffffffff8);
  pbVar5 = pbVar2 + sVar1 * 0x48;
  if (*(byte **)(dst + 8) < pbVar5) {
    pbVar3 = BumpAllocator::allocateSlow((BumpAllocator *)dst,sVar1 * 0x48,8);
    sVar1 = this->len;
    if (sVar1 == 0) goto LAB_003c1068;
    pCVar8 = this->data_;
    pCVar7 = pCVar8 + sVar1;
    pbVar5 = pbVar3 + sVar1 * 0x48;
    pbVar2 = pbVar3;
  }
  else {
    *(byte **)(*(long *)dst + 8) = pbVar5;
    pCVar8 = this->data_;
    pCVar7 = pCVar8 + sVar1;
    pbVar3 = pbVar2;
  }
  do {
    pbVar9 = pbVar2 + 0x48;
    pCVar6 = pCVar8;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *(CheckerInstanceBodySymbol **)pbVar2 = pCVar6->parent;
      pCVar6 = (pointer)((long)pCVar6 + ((ulong)bVar10 * -2 + 1) * 8);
      pbVar2 = pbVar2 + (ulong)bVar10 * -0x10 + 8;
    }
  } while ((pCVar8 + 1 != pCVar7) && (pCVar8 = pCVar8 + 1, pbVar2 = pbVar9, pbVar9 != pbVar5));
LAB_003c1068:
  return (int)pbVar3;
}

Assistant:

[[nodiscard]] std::span<T> copy(BumpAllocator& alloc) const {
        if (len == 0)
            return {};

        pointer dest = reinterpret_cast<pointer>(alloc.allocate(len * sizeof(T), alignof(T)));
        std::ranges::uninitialized_copy(begin(), end(), dest, dest + len);

        return std::span<T>(dest, len);
    }